

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

int LS_SetGlobalFogParameter
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg0 == 0) {
    ln_local._4_4_ = 1;
    fogdensity = arg1 >> 1;
  }
  else if (arg0 == 1) {
    ln_local._4_4_ = 1;
    outsidefogdensity = arg1 >> 1;
  }
  else if (arg0 == 2) {
    ln_local._4_4_ = 1;
    skyfog = arg1;
  }
  else {
    ln_local._4_4_ = 0;
  }
  return ln_local._4_4_;
}

Assistant:

int LS_SetGlobalFogParameter (line_t *ln, AActor *it, bool backSide,
	int arg0, int arg1, int arg2, int arg3, int arg4)
{
// SetGlobalFogParameter (type, value)
	switch(arg0)
	{
	case 0:
		fogdensity = arg1>>1;
		return true;

	case 1:
		outsidefogdensity = arg1>>1;
		return true;

	case 2:
		skyfog = arg1;
		return true;

	default:
		return false;
	}
}